

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

StringTree * capnp::compiler::tupleLiteral(Reader params)

{
  Reader exp;
  ListElementCount LVar1;
  StringTree *in_RDI;
  StringTree *in_R8;
  ulong count;
  StringPtr delim;
  ArrayBuilder<kj::StringTree> parts;
  ArrayPtr<const_char> local_150;
  IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
  local_140;
  StringTree part;
  StringTree local_f8;
  Reader local_c0;
  Reader param;
  Reader local_60;
  
  LVar1 = params.reader.elementCount;
  count = (ulong)params.reader.elementCount;
  parts.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>(count);
  parts.endPtr = parts.ptr + count;
  parts.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  parts.pos = parts.ptr;
  local_140.container = &params;
  for (local_140.index = 0; local_140.index != LVar1; local_140.index = local_140.index + 1) {
    _::
    IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
    ::operator*(&param,&local_140);
    Expression::Param::Reader::getValue(&local_c0,&param);
    exp._reader.capTable = local_c0._reader.capTable;
    exp._reader.segment = local_c0._reader.segment;
    exp._reader.data = local_c0._reader.data;
    exp._reader.pointers = local_c0._reader.pointers;
    exp._reader.dataSize = local_c0._reader.dataSize;
    exp._reader.pointerCount = local_c0._reader.pointerCount;
    exp._reader._38_2_ = local_c0._reader._38_2_;
    exp._reader.nestingLimit = local_c0._reader.nestingLimit;
    exp._reader._44_4_ = local_c0._reader._44_4_;
    expressionStringTree(exp);
    if ((0xf < param._reader.dataSize) && (*param._reader.data == 1)) {
      Expression::Param::Reader::getNamed(&local_60,&param);
      local_150 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_60);
      kj::strTree<capnp::Text::Reader,char_const(&)[4],kj::StringTree>
                (&local_f8,(kj *)&local_150,(Reader *)" = ",(char (*) [4])&part,in_R8);
      kj::StringTree::operator=(&part,&local_f8);
      kj::StringTree::~StringTree(&local_f8);
    }
    kj::StringTree::StringTree(parts.pos,&part);
    parts.pos = parts.pos + 1;
    kj::StringTree::~StringTree(&part);
  }
  local_f8.text.content.ptr = (char *)(((long)parts.pos - (long)parts.ptr) / 0x38);
  local_f8.size_ = (size_t)parts.ptr;
  local_f8.text.content.size_ = (size_t)parts.disposer;
  parts.ptr = (StringTree *)0x0;
  parts.pos = (RemoveConst<kj::StringTree> *)0x0;
  parts.endPtr = (StringTree *)0x0;
  delim.content.size_ = 3;
  delim.content.ptr = ", ";
  kj::StringTree::StringTree(&part,(Array<kj::StringTree> *)&local_f8,delim);
  kj::strTree<char_const(&)[3],kj::StringTree,char_const(&)[3]>
            (in_RDI,(kj *)"( ",(char (*) [3])&part,(StringTree *)" )",(char (*) [3])in_R8);
  kj::StringTree::~StringTree(&part);
  kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)&local_f8);
  kj::ArrayBuilder<kj::StringTree>::dispose(&parts);
  return in_RDI;
}

Assistant:

static kj::StringTree tupleLiteral(List<Expression::Param>::Reader params) {
  auto parts = kj::heapArrayBuilder<kj::StringTree>(params.size());
  for (auto param: params) {
    auto part = expressionStringTree(param.getValue());
    if (param.isNamed()) {
      part = kj::strTree(param.getNamed().getValue(), " = ", kj::mv(part));
    }
    parts.add(kj::mv(part));
  }
  return kj::strTree("( ", kj::StringTree(parts.finish(), ", "), " )");
}